

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkers.cpp
# Opt level: O0

int message_height_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38 [3];
  Am_Object local_20;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *self_local;
  
  local_10 = self;
  Am_Object::Get_Object((ushort)&local_20,(ulong)self);
  Am_Object::Get_Object((ushort)&local_18,(ulong)&local_20);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x67);
  iVar1 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::Get_Object((ushort)&local_40,(ulong)local_10);
  Am_Object::Get_Object((ushort)local_38,(ulong)&local_40);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_38,0x67);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::Get_Object((ushort)&local_50,(ulong)local_10);
  Am_Object::Get_Object((ushort)&local_48,(ulong)&local_50);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)&local_48,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(local_38);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_20);
  return iVar1 + 0x28 + iVar2 + iVar3;
}

Assistant:

Am_Define_Formula(int, message_height)
{
  return 40 + (int)self.Get_Object(BOARD).Get_Object(TEXT1).Get(Am_HEIGHT) +
         (int)self.Get_Object(BOARD).Get_Object(TEXT2).Get(Am_HEIGHT) +
         (int)self.Get_Object(BOARD).Get_Object(CIRCLE).Get(Am_HEIGHT);
}